

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SQLiteBuildDB.cpp
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_211c79::SQLiteBuildDB::lookupRuleResult
          (SQLiteBuildDB *this,KeyID keyID,KeyType *key,Result *result_out,string *error_out)

{
  sqlite3_stmt **ppsVar1;
  _Alloc_hider _Var2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  void *pvVar8;
  Epoch EVar9;
  value_type *pvVar10;
  value_type *pvVar11;
  uint64_t uVar12;
  KeyID KVar13;
  int __oflag;
  uint uVar14;
  DenseMapPair<llbuild::core::KeyID,_DBKeyID> *pDVar15;
  DependencyKeyIDs *pDVar16;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  Timestamp TVar17;
  BinaryDecoder decoder;
  string local_c0;
  DependencyKeyIDs *local_a0;
  DenseMapPair<llbuild::core::KeyID,_DBKeyID> *local_98;
  DBKeyID local_90;
  KeyID local_88;
  size_type local_80;
  Child local_78 [2];
  undefined2 local_68;
  Twine local_60;
  Twine local_48;
  
  local_88._value = keyID._value;
  if (this->delegate == (BuildDBDelegate *)0x0) {
    __assert_fail("delegate != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/SQLiteBuildDB.cpp"
                  ,0x1c3,
                  "virtual bool (anonymous namespace)::SQLiteBuildDB::lookupRuleResult(KeyID, const KeyType &, Result *, std::string *)"
                 );
  }
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)&this->dbMutex);
  if (iVar4 != 0) {
    std::__throw_system_error(iVar4);
  }
  if (result_out->builtAt != 0) {
    __assert_fail("result_out->builtAt == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/SQLiteBuildDB.cpp"
                  ,0x1c5,
                  "virtual bool (anonymous namespace)::SQLiteBuildDB::lookupRuleResult(KeyID, const KeyType &, Result *, std::string *)"
                 );
  }
  iVar4 = open(this,(char *)error_out,__oflag);
  if ((char)iVar4 != '\0') {
    bVar3 = llvm::
            DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
            ::LookupBucketFor<llbuild::core::KeyID>
                      ((DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
                        *)&this->dbKeyIDs,&local_88,
                       (DenseMapPair<llbuild::core::KeyID,_DBKeyID> **)&local_c0);
    _Var2._M_p = local_c0._M_dataplus._M_p;
    if ((bVar3) &&
       ((DenseMapPair<llbuild::core::KeyID,_DBKeyID> *)local_c0._M_dataplus._M_p !=
        (this->dbKeyIDs).Buckets + (this->dbKeyIDs).NumBuckets)) {
      iVar4 = sqlite3_reset(this->fastFindRuleResultStmt);
      if (iVar4 == 0) {
        pDVar16 = (DependencyKeyIDs *)&this->fastFindRuleResultStmt;
        iVar4 = sqlite3_clear_bindings(*(sqlite3_stmt **)pDVar16);
        if (iVar4 != 0) goto LAB_0015e0cc;
        iVar4 = sqlite3_bind_int64(*(sqlite3_stmt **)pDVar16,1,((DBKeyID *)(_Var2._M_p + 8))->value)
        ;
        if (iVar4 == 0) {
          iVar4 = sqlite3_step(*(sqlite3_stmt **)pDVar16);
          if (iVar4 != 100) goto LAB_0015e1a9;
          iVar4 = sqlite3_column_count(*(sqlite3_stmt **)pDVar16);
          if (iVar4 != 8) {
            __assert_fail("sqlite3_column_count(fastFindRuleResultStmt) == 8",
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/SQLiteBuildDB.cpp"
                          ,0x1e8,
                          "virtual bool (anonymous namespace)::SQLiteBuildDB::lookupRuleResult(KeyID, const KeyType &, Result *, std::string *)"
                         );
          }
          local_90.value = sqlite3_column_int64(*(sqlite3_stmt **)pDVar16,0);
          iVar4 = sqlite3_column_bytes(*(sqlite3_stmt **)pDVar16,1);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    (&result_out->value,(long)iVar4);
          local_a0 = (DependencyKeyIDs *)
                     (result_out->value).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
          pvVar8 = (void *)sqlite3_column_blob(*(sqlite3_stmt **)pDVar16,1);
          memcpy(local_a0,pvVar8,(long)iVar4);
          EVar9 = sqlite3_column_int64(*(sqlite3_stmt **)pDVar16,2);
          result_out->builtAt = EVar9;
          EVar9 = sqlite3_column_int64(*(sqlite3_stmt **)pDVar16,3);
          result_out->computedAt = EVar9;
          TVar17 = (Timestamp)sqlite3_column_double(*(sqlite3_stmt **)pDVar16,4);
          result_out->start = TVar17;
          TVar17 = (Timestamp)sqlite3_column_double(*(sqlite3_stmt **)pDVar16,5);
          result_out->end = TVar17;
LAB_0015e2cd:
          uVar5 = sqlite3_column_bytes
                            ((pDVar16->keys).
                             super__Vector_base<llbuild::core::KeyID,_std::allocator<llbuild::core::KeyID>_>
                             ._M_impl.super__Vector_impl_data._M_start,6);
          local_98 = (DenseMapPair<llbuild::core::KeyID,_DBKeyID> *)
                     sqlite3_column_blob((pDVar16->keys).
                                         super__Vector_base<llbuild::core::KeyID,_std::allocator<llbuild::core::KeyID>_>
                                         ._M_impl.super__Vector_impl_data._M_start,6);
          uVar12 = sqlite3_column_int64
                             ((pDVar16->keys).
                              super__Vector_base<llbuild::core::KeyID,_std::allocator<llbuild::core::KeyID>_>
                              ._M_impl.super__Vector_impl_data._M_start,7);
          (result_out->signature).value = uVar12;
          if ((uVar5 & 7) == 0) {
            uVar14 = (int)uVar5 >> 3;
            local_80 = (size_type)(int)uVar5;
            local_a0 = &result_out->dependencies;
            std::vector<llbuild::core::KeyID,_std::allocator<llbuild::core::KeyID>_>::resize
                      (&local_a0->keys,(long)(int)uVar14);
            this_00 = &(result_out->dependencies).flags;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      (this_00,(long)(int)uVar14);
            local_c0._M_dataplus._M_p = (pointer)local_98;
            local_c0._M_string_length = local_80;
            local_c0.field_2._M_allocated_capacity = 0;
            bVar3 = true;
            if (7 < uVar5) {
              local_98 = (DenseMapPair<llbuild::core::KeyID,_DBKeyID> *)(ulong)uVar14;
              pDVar15 = (DenseMapPair<llbuild::core::KeyID,_DBKeyID> *)0x0;
              do {
                uVar6 = llbuild::basic::BinaryDecoder::read32((BinaryDecoder *)&local_c0);
                uVar7 = llbuild::basic::BinaryDecoder::read32((BinaryDecoder *)&local_c0);
                KVar13 = getKeyIDForID(this,(DBKeyID)(CONCAT44(uVar7,uVar6) >> 2),error_out);
                bVar3 = error_out->_M_string_length == 0;
                if (!bVar3) break;
                (local_a0->keys).
                super__Vector_base<llbuild::core::KeyID,_std::allocator<llbuild::core::KeyID>_>.
                _M_impl.super__Vector_impl_data._M_start[(long)pDVar15]._value = KVar13._value;
                *(byte *)((long)&(pDVar15->super_pair<llbuild::core::KeyID,_DBKeyID>).first._value +
                         (long)(this_00->
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                               _M_impl.super__Vector_impl_data._M_start) = (byte)uVar6 & 3;
                pDVar15 = (DenseMapPair<llbuild::core::KeyID,_DBKeyID> *)
                          ((long)&(pDVar15->super_pair<llbuild::core::KeyID,_DBKeyID>).first._value
                          + 1);
              } while (local_98 != pDVar15);
            }
            goto LAB_0015e156;
          }
          llvm::Twine::Twine(&local_60,"unexpected contents for database result: ");
          local_68 = 0x10a;
          local_78[0].decUI = (uint)local_90.value;
          llvm::operator+(&local_48,&local_60,(Twine *)local_78);
          llvm::Twine::str_abi_cxx11_(&local_c0,&local_48);
          std::__cxx11::string::operator=((string *)error_out,(string *)&local_c0);
          goto LAB_0015e1cd;
        }
      }
LAB_0015e11a:
      (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_(&local_c0,this);
      std::__cxx11::string::operator=((string *)error_out,(string *)&local_c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p == &local_c0.field_2) goto LAB_0015e154;
    }
    else {
      iVar4 = sqlite3_reset(this->findRuleResultStmt);
      if (iVar4 != 0) {
LAB_0015e0cc:
        (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_(&local_c0,this);
        std::__cxx11::string::operator=((string *)error_out,(string *)&local_c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        }
        bVar3 = false;
        goto LAB_0015e156;
      }
      ppsVar1 = &this->findRuleResultStmt;
      iVar4 = sqlite3_clear_bindings(*ppsVar1);
      if (iVar4 != 0) goto LAB_0015e11a;
      local_a0 = (DependencyKeyIDs *)ppsVar1;
      iVar4 = sqlite3_bind_text(*ppsVar1,1,(key->key)._M_dataplus._M_p,
                                (int)(key->key)._M_string_length,0);
      pDVar16 = local_a0;
      if (iVar4 == 0) {
        iVar4 = sqlite3_step((local_a0->keys).
                             super__Vector_base<llbuild::core::KeyID,_std::allocator<llbuild::core::KeyID>_>
                             ._M_impl.super__Vector_impl_data._M_start);
        if (iVar4 == 100) {
          iVar4 = sqlite3_column_count
                            ((pDVar16->keys).
                             super__Vector_base<llbuild::core::KeyID,_std::allocator<llbuild::core::KeyID>_>
                             ._M_impl.super__Vector_impl_data._M_start);
          if (iVar4 != 8) {
            __assert_fail("sqlite3_column_count(findRuleResultStmt) == 8",
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/SQLiteBuildDB.cpp"
                          ,0x211,
                          "virtual bool (anonymous namespace)::SQLiteBuildDB::lookupRuleResult(KeyID, const KeyType &, Result *, std::string *)"
                         );
          }
          local_90.value = sqlite3_column_int64(this->findRuleResultStmt,0);
          iVar4 = sqlite3_column_bytes(this->findRuleResultStmt,1);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    (&result_out->value,(long)iVar4);
          local_98 = (DenseMapPair<llbuild::core::KeyID,_DBKeyID> *)
                     (result_out->value).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
          pvVar8 = (void *)sqlite3_column_blob(this->findRuleResultStmt,1);
          memcpy(local_98,pvVar8,(long)iVar4);
          EVar9 = sqlite3_column_int64(this->findRuleResultStmt,2);
          result_out->builtAt = EVar9;
          EVar9 = sqlite3_column_int64(this->findRuleResultStmt,3);
          result_out->computedAt = EVar9;
          TVar17 = (Timestamp)sqlite3_column_double(this->findRuleResultStmt,4);
          result_out->start = TVar17;
          TVar17 = (Timestamp)sqlite3_column_double(this->findRuleResultStmt,5);
          result_out->end = TVar17;
          pvVar10 = llvm::
                    DenseMapBase<llvm::DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>,_DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
                    ::FindAndConstruct((DenseMapBase<llvm::DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>,_DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
                                        *)&this->engineKeyIDs,&local_90);
          (pvVar10->super_pair<DBKeyID,_llbuild::core::KeyID>).second._value = local_88._value;
          pvVar11 = llvm::
                    DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
                    ::FindAndConstruct((DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
                                        *)&this->dbKeyIDs,&local_88);
          (pvVar11->super_pair<llbuild::core::KeyID,_DBKeyID>).second.value = local_90.value;
          pDVar16 = local_a0;
          goto LAB_0015e2cd;
        }
LAB_0015e1a9:
        if (iVar4 == 0x65) goto LAB_0015e154;
      }
      (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_(&local_c0,this);
      std::__cxx11::string::operator=((string *)error_out,(string *)&local_c0);
LAB_0015e1cd:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p == &local_c0.field_2) goto LAB_0015e154;
    }
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
LAB_0015e154:
  bVar3 = false;
LAB_0015e156:
  pthread_mutex_unlock((pthread_mutex_t *)&this->dbMutex);
  return bVar3;
}

Assistant:

virtual bool lookupRuleResult(KeyID keyID, const KeyType& key,
                                Result* result_out,
                                std::string *error_out) override {
    assert(delegate != nullptr);
    std::lock_guard<std::mutex> guard(dbMutex);
    assert(result_out->builtAt == 0);

    if (!open(error_out)) {
      return false;
    }

    // Fetch the basic rule information.
    int result;
    int numDependencyBytes = 0;
    const void* dependencyBytes = nullptr;
    DBKeyID dbKeyID;

    // Check if we already have the key mapping
    auto it = dbKeyIDs.find(keyID);
    if (it != dbKeyIDs.end()) {
      // DBKeyID is known, perform the fast path that avoids table joining

      result = sqlite3_reset(fastFindRuleResultStmt);
      checkSQLiteResultOKReturnFalse(result);
      result = sqlite3_clear_bindings(fastFindRuleResultStmt);
      checkSQLiteResultOKReturnFalse(result);
      result = sqlite3_bind_int64(fastFindRuleResultStmt, /*index=*/1,
                                  it->second.value);
      checkSQLiteResultOKReturnFalse(result);

      // If the rule wasn't found, we are done.
      result = sqlite3_step(fastFindRuleResultStmt);
      if (result == SQLITE_DONE)
        return false;
      if (result != SQLITE_ROW) {
        *error_out = getCurrentErrorMessage();
        return false;
      }

      // Otherwise, read the result contents from the row.
      assert(sqlite3_column_count(fastFindRuleResultStmt) == 8);
      dbKeyID = DBKeyID(sqlite3_column_int64(fastFindRuleResultStmt, 0));
      int numValueBytes = sqlite3_column_bytes(fastFindRuleResultStmt, 1);
      result_out->value.resize(numValueBytes);
      memcpy(result_out->value.data(),
             sqlite3_column_blob(fastFindRuleResultStmt, 1),
             numValueBytes);
      result_out->builtAt = sqlite3_column_int64(fastFindRuleResultStmt, 2);
      result_out->computedAt = sqlite3_column_int64(fastFindRuleResultStmt, 3);
      result_out->start = sqlite3_column_double(fastFindRuleResultStmt, 4);
      result_out->end = sqlite3_column_double(fastFindRuleResultStmt, 5);

      // Extract the dependencies binary blob.
      numDependencyBytes = sqlite3_column_bytes(fastFindRuleResultStmt, 6);
      dependencyBytes = sqlite3_column_blob(fastFindRuleResultStmt, 6);

      // Extract the signature
      result_out->signature =
        basic::CommandSignature(sqlite3_column_int64(fastFindRuleResultStmt, 7));
    } else {
      // KeyID is not known, perform the 'normal' search using the key value

      result = sqlite3_reset(findRuleResultStmt);
      checkSQLiteResultOKReturnFalse(result);
      result = sqlite3_clear_bindings(findRuleResultStmt);
      checkSQLiteResultOKReturnFalse(result);
      result = sqlite3_bind_text(findRuleResultStmt, /*index=*/1,
                                 key.data(), key.size(),
                                 SQLITE_STATIC);
      checkSQLiteResultOKReturnFalse(result);

      // If the rule wasn't found, we are done.
      result = sqlite3_step(findRuleResultStmt);
      if (result == SQLITE_DONE)
        return false;
      if (result != SQLITE_ROW) {
        *error_out = getCurrentErrorMessage();
        return false;
      }

      // Otherwise, read the result contents from the row.
      assert(sqlite3_column_count(findRuleResultStmt) == 8);
      dbKeyID = DBKeyID(sqlite3_column_int64(findRuleResultStmt, 0));
      int numValueBytes = sqlite3_column_bytes(findRuleResultStmt, 1);
      result_out->value.resize(numValueBytes);
      memcpy(result_out->value.data(),
             sqlite3_column_blob(findRuleResultStmt, 1),
             numValueBytes);
      result_out->builtAt = sqlite3_column_int64(findRuleResultStmt, 2);
      result_out->computedAt = sqlite3_column_int64(findRuleResultStmt, 3);
      result_out->start = sqlite3_column_double(findRuleResultStmt, 4);
      result_out->end = sqlite3_column_double(findRuleResultStmt, 5);

      // Cache the engine key mapping
      engineKeyIDs[dbKeyID] = keyID;
      dbKeyIDs[keyID] = dbKeyID;

      // Extract the dependencies binary blob.
      numDependencyBytes = sqlite3_column_bytes(findRuleResultStmt, 6);
      dependencyBytes = sqlite3_column_blob(findRuleResultStmt, 6);

      // Extract the signature
      result_out->signature =
        basic::CommandSignature(sqlite3_column_int64(findRuleResultStmt, 7));
    }


    int numDependencies = numDependencyBytes / sizeof(uint64_t);
    if (numDependencyBytes != static_cast<int>(numDependencies * sizeof(uint64_t))) {
      *error_out = (llvm::Twine("unexpected contents for database result: ") +
                    llvm::Twine((int)dbKeyID.value)).str();
      return false;
    }
    result_out->dependencies.resize(numDependencies);
    basic::BinaryDecoder decoder(
        StringRef((const char*)dependencyBytes, numDependencyBytes));
    for (auto i = 0; i != numDependencies; ++i) {
      uint64_t raw;
      decoder.read(raw);
      bool orderOnly = raw & 1;
      bool singleUse = (raw >> 1) & 1;
      DBKeyID dbKeyID(raw >> 2);

      // Map the database key ID into an engine key ID (note that we already
      // hold the dbMutex at this point as required by getKeyIDforID())
      KeyID keyID = getKeyIDForID(dbKeyID, error_out);
      if (!error_out->empty()) {
        return false;
      }
      result_out->dependencies.set(i, keyID, orderOnly, singleUse);
    }

    return true;
  }